

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O0

int __thiscall
FormatTypeEDSK::SaveDisk
          (FormatTypeEDSK *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uchar uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  Track *pTVar7;
  size_type sVar8;
  char *__s;
  reference pvVar9;
  Track *pTVar10;
  int iVar11;
  ulong uVar12;
  Track *local_1a0;
  int local_180;
  int dbg;
  int cpt;
  int index;
  uint sector_index;
  int offset_data;
  uchar *track_data;
  unsigned_short size_1;
  Track *info_track;
  int i_1;
  uint j_1;
  uint uStack_148;
  unsigned_short size;
  int i;
  uint j;
  int offset;
  Track *track;
  uchar dib [256];
  uint nb_sectors;
  int res;
  FILE *file;
  ILoadingProgress *loading_progress_local;
  IDisk *disk_local;
  char *file_path_local;
  FormatTypeEDSK *this_local;
  
  file = (FILE *)loading_progress;
  loading_progress_local = (ILoadingProgress *)disk;
  disk_local = (IDisk *)file_path;
  file_path_local = (char *)this;
  dib._252_4_ = IDisk::SmartOpen(disk,(FILE **)&nb_sectors,file_path,".DSK");
  if (dib._252_4_ == 0) {
    dib[0xf8] = '\0';
    dib[0xf9] = '\0';
    dib[0xfa] = '\0';
    dib[0xfb] = '\0';
    memset(&track,0,0x100);
    memcpy(&track,"EXTENDED CPC DSK File\r\nDisk-Info\r\n",0x22);
    builtin_memcpy(dib + 0x1a,"SugarBox\r\n",10);
    dib[0x28] = (uchar)*(undefined4 *)(loading_progress_local + 0x20);
    dib[0x29] = *(uchar *)(loading_progress_local + 8);
    uVar4 = CONCAT44(0,*(int *)(loading_progress_local + 0x20) *
                       (uint)(byte)loading_progress_local[8]);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(0x20),0);
    uVar12 = uVar5 + 8;
    if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar12 = 0xffffffffffffffff;
    }
    puVar6 = (ulong *)operator_new__(uVar12);
    *puVar6 = uVar4;
    pTVar10 = (Track *)(puVar6 + 1);
    if (uVar4 != 0) {
      local_1a0 = pTVar10;
      do {
        IDisk::Track::Track(local_1a0);
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != pTVar10 + uVar4);
    }
    i = 0x34;
    for (uStack_148 = 0; uStack_148 < *(uint *)(loading_progress_local + 0x20);
        uStack_148 = uStack_148 + 1) {
      for (j_1 = 0; (int)j_1 < (int)(uint)(byte)loading_progress_local[8]; j_1 = j_1 + 1) {
        i_1._2_2_ = IDisk::GetTrackInfo((IDisk *)loading_progress_local,j_1,uStack_148,
                                        pTVar10 + (uStack_148 * (byte)loading_progress_local[8] +
                                                  j_1));
        if (i_1._2_2_ != 0) {
          if (pTVar10[uStack_148 * (byte)loading_progress_local[8] + j_1].full_size_ == 0) {
            i_1._2_2_ = 0;
          }
          else if ((i_1._2_2_ & 0xff00) < i_1._2_2_) {
            i_1._2_2_ = i_1._2_2_ + 0x100;
          }
        }
        dib[(long)i + -8] = (uchar)(i_1._2_2_ >> 8);
        i = i + 1;
      }
    }
    fwrite(&track,0x100,1,_nb_sectors);
    for (info_track._4_4_ = 0; info_track._4_4_ < *(uint *)(loading_progress_local + 0x20);
        info_track._4_4_ = info_track._4_4_ + 1) {
      for (info_track._0_4_ = 0; (int)info_track < (int)(uint)(byte)loading_progress_local[8];
          info_track._0_4_ = (int)info_track + 1) {
        pTVar7 = pTVar10 + (info_track._4_4_ * (byte)loading_progress_local[8] + (int)info_track);
        sVar8 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                          (&pTVar7->list_sector_);
        if (sVar8 != 0) {
          bVar1 = dib[(ulong)((int)info_track + 0x34 +
                             info_track._4_4_ * (byte)loading_progress_local[8]) - 8];
          __s = (char *)operator_new__((ulong)bVar1 << 8);
          memset(__s,0,(ulong)bVar1 << 8);
          __s[0] = 'T';
          __s[1] = 'r';
          __s[2] = 'a';
          __s[3] = 'c';
          __s[4] = 'k';
          __s[5] = '-';
          __s[6] = 'I';
          __s[7] = 'n';
          __s[8] = 'f';
          __s[9] = 'o';
          __s[10] = '\r';
          __s[0xb] = '\n';
          __s[0x10] = (char)info_track._4_4_;
          __s[0x11] = (char)(int)info_track;
          pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                             (&pTVar7->list_sector_,0);
          __s[0x14] = pvVar9->n;
          sVar8 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                            (&pTVar7->list_sector_);
          __s[0x15] = (char)sVar8;
          __s[0x16] = (char)pTVar7->gap3_size_;
          __s[0x17] = -0x1b;
          i = 0x18;
          index = 0x100;
          for (cpt = 0; sVar8 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                                          (&pTVar7->list_sector_), (uint)cpt < sVar8; cpt = cpt + 1)
          {
            dib._248_4_ = dib._248_4_ + 1;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            __s[i] = pvVar9->c;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            __s[i + 1] = pvVar9->h;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            __s[i + 2] = pvVar9->r;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            __s[i + 3] = pvVar9->n;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            __s[i + 4] = pvVar9->status1;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            __s[i + 5] = pvVar9->status2;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            iVar11 = i + 7;
            __s[i + 6] = (char)pvVar9->real_size;
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            i = i + 8;
            __s[iVar11] = (char)(pvVar9->real_size >> 8);
            pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                               (&pTVar7->list_sector_,(ulong)(uint)cpt);
            dbg = pvVar9->dam_offset + 0x40;
            for (local_180 = 0;
                pvVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                   (&pTVar7->list_sector_,(ulong)(uint)cpt),
                local_180 < (int)(uint)pvVar9->real_size; local_180 = local_180 + 1) {
              uVar3 = IDisk::GetNextByte((IDisk *)loading_progress_local,(int)info_track,
                                         info_track._4_4_,dbg);
              __s[index] = uVar3;
              dbg = dbg + 0x10;
              index = index + 1;
            }
          }
          fwrite(__s,(ulong)bVar1 << 8,1,_nb_sectors);
          if (__s != (char *)0x0) {
            operator_delete__(__s);
          }
        }
      }
    }
    fclose(_nb_sectors);
    if (pTVar10 != (Track *)0x0) {
      uVar4 = *puVar6;
      pTVar7 = pTVar10 + uVar4;
      while (pTVar10 != pTVar7) {
        pTVar7 = pTVar7 + -1;
        IDisk::Track::~Track(pTVar7);
      }
      operator_delete__(puVar6,uVar4 * 0x20 + 8);
    }
    loading_progress_local[0x3c] = (ILoadingProgress)0x0;
  }
  return 0;
}

Assistant:

int FormatTypeEDSK::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   FILE* file;
   int res = disk->SmartOpen(&file, file_path, ".DSK");

   if (res == 0)
   {
      // DISK INFORMATION BLOCK
      unsigned int nb_sectors = 0;
      unsigned char dib[0x100] = {0};
      memcpy(dib, "EXTENDED CPC DSK File\r\nDisk-Info\r\n", 34);
      memcpy(&dib[0x22], "SugarBox\r\n", 10);

      dib[0x30] = disk->side_[0].nb_tracks;
      dib[0x31] = disk->nb_sides_;
      //memcpy ( &dib[0x30], &m_Disk[0].NbTracks , 1 );
      //memcpy ( &dib[0x31], &m_NbSide , 1 );

      // Track size table
      // For each track :
      IDisk::Track* track = new IDisk::Track[disk->side_[0].nb_tracks * disk->nb_sides_];

      int offset = 0x34;
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            // Get size
            unsigned short size = disk->GetTrackInfo(i, j, &track[j * disk->nb_sides_ + i]);

            if (size != 0)
            {
               if (track[j * disk->nb_sides_ + i].full_size_ == 0)
               {
                  size = 0;
               }
               else if ((size & 0xFFFFFF00) < size)
               {
                  size += 0x100;
               }
            }
            dib[offset++] = (unsigned char)(size >> 8);
         }
      }
      fwrite(dib, 0x100, 1, file);

      // For each track :
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            IDisk::Track* info_track = &track[j * disk->nb_sides_ + i];

            if (info_track->list_sector_.size() > 0)
            {
               // Allocate proper size
               unsigned short size = (dib[0x34 + i + (j * disk->nb_sides_)] << 8);

               unsigned char* track_data = new unsigned char[size];
               memset(track_data, 0, size);
               // Generate track data
               memcpy(track_data, "Track-Info\r\n", 12);
               track_data[0x10] = j;
               track_data[0x11] = i;

               // SZ = First N...
               track_data[0x14] = info_track->list_sector_[0].n;
               track_data[0x15] = static_cast<unsigned char>(info_track->list_sector_.size());
               track_data[0x16] = info_track->gap3_size_;
               track_data[0x17] = 0xE5; // ?

               // Sector information list
               offset = 0x18;
               int offset_data = 0x100;
               //for (std::vector<tSector>::iterator it = info_track->listSector.begin(); it != info_track->listSector.end(); it++)
               for (unsigned int sector_index = 0; sector_index < info_track->list_sector_.size(); sector_index++)
               {
                  ++nb_sectors;
                  track_data[offset++] = info_track->list_sector_[sector_index].c; // it->C;
                  track_data[offset++] = info_track->list_sector_[sector_index].h; // it->H;
                  track_data[offset++] = info_track->list_sector_[sector_index].r; // it->R;
                  track_data[offset++] = info_track->list_sector_[sector_index].n; // it->N;
                  track_data[offset++] = info_track->list_sector_[sector_index].status1; // it->Status1;
                  track_data[offset++] = info_track->list_sector_[sector_index].status2; // ->Status2;
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size & 0xFF;
                  // (it->RealSize & 0xFF);
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size >> 8; // (it->RealSize >> 8);

                  // Data
                  int index = info_track->list_sector_[sector_index].dam_offset + 64;
                  // it->DAMOffset + 64; // Jump the A1A1A1F8/B 4 bytes of IDAM.

                  for (int cpt = 0; cpt < info_track->list_sector_[sector_index].real_size/*  it->RealSize*/; cpt++)
                  {
                     track_data[offset_data++] = disk->GetNextByte(i, j, index);
                     if (offset_data > size)
                     {
                        int dbg = 1;
                     }
                     index += 16;
                  }
               }
               // Write it to the disk
               fwrite(track_data, size, 1, file);

               // Free tracks
               delete[]track_data;
            }
         }
      }

      // Free ressources
      fclose(file);
      delete[]track;

      disk->disk_modified_ = false;
   }
   return 0;
}